

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall CLIntercept::checkRemoveSamplerString(CLIntercept *this,cl_sampler sampler)

{
  mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  pair<std::_Rb_tree_iterator<std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar3;
  cl_uint refCount;
  int local_1c;
  cl_sampler local_18;
  
  __mutex = &this->m_Mutex;
  local_18 = sampler;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    local_1c = 0;
    (*(this->m_Dispatch).clGetSamplerInfo)(local_18,0x1150,4,&local_1c,(size_t *)0x0);
    if (local_1c == 1) {
      pVar3 = std::
              _Rb_tree<_cl_sampler_*,_std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<_cl_sampler_*>,_std::allocator<std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::equal_range(&(this->m_SamplerDataMap)._M_t,&local_18);
      std::
      _Rb_tree<_cl_sampler_*,_std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<_cl_sampler_*>,_std::allocator<std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&(this->m_SamplerDataMap)._M_t,(_Base_ptr)pVar3.first._M_node,
                     (_Base_ptr)pVar3.second._M_node);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void CLIntercept::checkRemoveSamplerString(
    cl_sampler sampler )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_uint refCount = getRefCount( sampler );
    if( refCount == 1 )
    {
        m_SamplerDataMap.erase( sampler );
    }
}